

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPackingFunctionTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::UnpackSnorm2x16Case::iterate(UnpackSnorm2x16Case *this)

{
  ostringstream *poVar1;
  ShaderExecutor *pSVar2;
  UnpackSnorm2x16Case *pUVar3;
  deUint32 dVar4;
  ostream *poVar5;
  TestLog *pTVar6;
  uint *puVar7;
  char *description;
  int iVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  void *out;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> outputs;
  Random rnd;
  void *in;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  Hex<8UL> local_218;
  UnpackSnorm2x16Case *local_210;
  undefined1 local_208 [16];
  pointer local_1f8;
  float local_1e8;
  float fStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  float local_1d8;
  float fStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  ulong local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [384];
  
  dVar4 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c0,dVar4 ^ 0x776002);
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_1f8 = (pointer)0x0;
  local_208 = (undefined1  [16])0x0;
  local_1b0._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_238,(iterator)0x0,(uint *)local_1b0);
  local_1b0._0_4_ = 0x7fff8000;
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x7fff8000;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0x80007fff;
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x80007fff;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0xffffffff;
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xffffffff;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0x1fffe;
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x1fffe;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar8 = 0x5f;
  do {
    dVar4 = deRandom_getUint32(&local_1c0);
    local_1b0._0_4_ = dVar4;
    if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_238,
                 (iterator)
                 local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1b0);
    }
    else {
      *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = dVar4;
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_208,
             (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  local_1b0._0_8_ =
       ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Executing shader for ",0x15)
  ;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  local_1b0._0_8_ =
       local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_218.value = local_208._0_8_;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar2 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar2->_vptr_ShaderExecutor[6])
            (pSVar2,(ulong)((long)local_238.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_238.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,local_1b0,&local_218
            );
  local_1c8 = (ulong)((long)local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
  local_210 = this;
  if ((int)local_1c8 < 1) {
    iVar8 = 0;
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    lVar10 = 0;
    iVar8 = 0;
    pTVar6 = (TestLog *)
             local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      auVar13 = ZEXT416(*(uint *)((long)&pTVar6->m_log + lVar10 * 4));
      auVar13 = pshuflw(auVar13,auVar13,0x60);
      auVar14._0_4_ = (float)(auVar13._0_4_ >> 0x10);
      auVar14._4_4_ = (float)(auVar13._4_4_ >> 0x10);
      auVar14._8_4_ = (float)(auVar13._8_4_ >> 0x10);
      auVar14._12_4_ = (float)(auVar13._12_4_ >> 0x10);
      auVar14 = divps(auVar14,ZEXT816(0x46fffe0046fffe00));
      auVar13 = minps(ZEXT816(0x3f8000003f800000),auVar14);
      uVar11 = -(uint)(auVar14._0_4_ < -1.0);
      uVar12 = -(uint)(auVar14._4_4_ < -1.0);
      uStack_1d0 = ~-(uint)(auVar14._8_4_ < 0.0) & auVar13._8_4_;
      uStack_1cc = ~-(uint)(auVar14._12_4_ < 0.0) & auVar13._12_4_;
      local_1d8 = (float)(~uVar11 & auVar13._0_4_ | uVar11 & 0xbf800000);
      fStack_1d4 = (float)(~uVar12 & auVar13._4_4_ | uVar12 & 0xbf800000);
      local_1e8 = ((pointer)(local_208._0_8_ + lVar10 * 8))->m_data[0];
      fStack_1e4 = ((pointer)(local_208._0_8_ + lVar10 * 8))->m_data[1];
      uStack_1e0 = 0;
      uStack_1dc = 0;
      if (1 < (-(uint)((int)-fStack_1e4 < (int)-fStack_1d4) -
               ((int)fStack_1d4 - (int)fStack_1e4 ^ -(uint)((int)-fStack_1e4 < (int)-fStack_1d4)) |
              -(uint)((int)-local_1e8 < (int)-local_1d8) -
              ((int)local_1d8 - (int)local_1e8 ^ -(uint)((int)-local_1e8 < (int)-local_1d8)))) {
        if (iVar8 < 10) {
          local_1b0._0_8_ =
               ((local_210->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(poVar1,(int)lVar10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"  expected unpackSnorm2x16(",0x1b);
          local_218.value =
               (deUint64)
               *(uint *)((long)(qpTestLog **)
                               local_238.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar10 * 4);
          tcu::Format::Hex<8UL>::toStream(&local_218,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") = ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"vec2(",5);
          poVar5 = std::ostream::_M_insert<double>((double)local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_218.value = (deUint64)(uint)local_1d8;
          tcu::Format::Hex<8UL>::toStream(&local_218,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          poVar5 = std::ostream::_M_insert<double>((double)fStack_1d4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_218.value = (deUint64)(uint)fStack_1d4;
          tcu::Format::Hex<8UL>::toStream(&local_218,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got vec2(",0xb);
          poVar5 = std::ostream::_M_insert<double>((double)local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_218.value = (deUint64)(uint)local_1e8;
          tcu::Format::Hex<8UL>::toStream(&local_218,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          poVar5 = std::ostream::_M_insert<double>((double)fStack_1e4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
          local_218.value = (deUint64)(uint)fStack_1e4;
          tcu::Format::Hex<8UL>::toStream(&local_218,poVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"\n  ULP diffs = (",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"), max diff = ",0xe)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        }
        else if (iVar8 == 10) {
          local_1b0._0_8_ =
               ((local_210->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b0 + 8),"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        }
        iVar8 = iVar8 + 1;
        pTVar6 = (TestLog *)
                 local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar7 = local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)((ulong)((long)puVar7 - (long)pTVar6) >> 2));
  }
  pUVar3 = local_210;
  local_1b0._0_8_ =
       ((local_210->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
       m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  iVar9 = (int)local_1c8;
  std::ostream::operator<<(poVar1,iVar9 - iVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
  std::ostream::operator<<(poVar1,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  description = "Pass";
  if (iVar8 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((pUVar3->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iVar8 != 0),description);
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_,(long)local_1f8 - local_208._0_8_);
  }
  if ((TestLog *)
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec2>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deInt16	in0			= (deInt16)(deUint16)(inputs[valNdx] & 0xffff);
				const deInt16	in1			= (deInt16)(deUint16)(inputs[valNdx] >> 16);
				const float		ref0		= de::clamp(float(in0) / 32767.f, -1.0f, 1.0f);
				const float		ref1		= de::clamp(float(in1) / 32767.f, -1.0f, 1.0f);
				const float		res0		= outputs[valNdx].x();
				const float		res1		= outputs[valNdx].y();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackSnorm2x16(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec2(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ")"
															   << ", got vec2(" << HexFloat(res0) << ", " << HexFloat(res1) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}